

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation_binding.cpp
# Opt level: O2

bool __thiscall
duckdb::CollationBinding::PushCollation
          (CollationBinding *this,ClientContext *context,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *source,
          LogicalType *sql_type,CollationType type)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  pointer pCVar4;
  CollationCallback *collation;
  
  pCVar1 = (this->collations).
           super_vector<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>.
           super__Vector_base<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (this->collations).
           super_vector<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>.
           super__Vector_base<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pCVar4 = pCVar2;
    if (pCVar4 == pCVar1) break;
    bVar3 = (*pCVar4->try_push_collation)(context,source,sql_type,type);
    pCVar2 = pCVar4 + 1;
  } while (!bVar3);
  return pCVar4 != pCVar1;
}

Assistant:

bool CollationBinding::PushCollation(ClientContext &context, unique_ptr<Expression> &source,
                                     const LogicalType &sql_type, CollationType type) const {
	for (auto &collation : collations) {
		if (collation.try_push_collation(context, source, sql_type, type)) {
			// successfully pushed a collation
			return true;
		}
	}
	return false;
}